

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3DropTrigger(Parse *pParse,SrcList *pName,int noErr)

{
  uint uVar1;
  sqlite3 *db;
  char *zRight;
  char *pKey;
  Db *pDVar2;
  int iVar3;
  HashElem *pHVar4;
  uint uVar5;
  uint uVar6;
  
  db = pParse->db;
  if (db->mallocFailed == '\0') {
    iVar3 = sqlite3ReadSchema(pParse);
    if (iVar3 == 0) {
      zRight = pName->a[0].zDatabase;
      uVar1 = db->nDb;
      if (0 < (int)uVar1) {
        pKey = pName->a[0].zName;
        pDVar2 = db->aDb;
        uVar5 = 0;
        do {
          uVar6 = uVar5 < 2 ^ uVar5;
          if (zRight == (char *)0x0) {
LAB_001688c5:
            pHVar4 = findElementWithHash(&(pDVar2[uVar6].pSchema)->trigHash,pKey,(uint *)0x0);
            if ((Trigger *)pHVar4->data != (Trigger *)0x0) {
              sqlite3DropTriggerPtr(pParse,(Trigger *)pHVar4->data);
              goto LAB_00168941;
            }
          }
          else {
            iVar3 = sqlite3StrICmp(pDVar2[uVar6].zDbSName,zRight);
            if (iVar3 == 0) goto LAB_001688c5;
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      if (noErr == 0) {
        sqlite3ErrorMsg(pParse,"no such trigger: %S",pName,0);
      }
      else {
        sqlite3CodeVerifyNamedSchema(pParse,zRight);
      }
      pParse->checkSchema = '\x01';
    }
  }
LAB_00168941:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTrigger(Parse *pParse, SrcList *pName, int noErr){
  Trigger *pTrigger = 0;
  int i;
  const char *zDb;
  const char *zName;
  sqlite3 *db = pParse->db;

  if( db->mallocFailed ) goto drop_trigger_cleanup;
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto drop_trigger_cleanup;
  }

  assert( pName->nSrc==1 );
  zDb = pName->a[0].zDatabase;
  zName = pName->a[0].zName;
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    if( zDb && sqlite3StrICmp(db->aDb[j].zDbSName, zDb) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    pTrigger = sqlite3HashFind(&(db->aDb[j].pSchema->trigHash), zName);
    if( pTrigger ) break;
  }
  if( !pTrigger ){
    if( !noErr ){
      sqlite3ErrorMsg(pParse, "no such trigger: %S", pName, 0);
    }else{
      sqlite3CodeVerifyNamedSchema(pParse, zDb);
    }
    pParse->checkSchema = 1;
    goto drop_trigger_cleanup;
  }
  sqlite3DropTriggerPtr(pParse, pTrigger);

drop_trigger_cleanup:
  sqlite3SrcListDelete(db, pName);
}